

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# san.h
# Opt level: O0

void san_junk_ptr_locations(void *ptr,size_t usize,void **first,void **mid,void **last)

{
  size_t ptr_sz;
  void **last_local;
  void **mid_local;
  void **first_local;
  size_t usize_local;
  void *ptr_local;
  
  *first = ptr;
  *mid = (void *)((long)ptr + (usize >> 1 & 0xfffffffffffffff8));
  *last = (void *)((long)ptr + (usize - 8));
  return;
}

Assistant:

static inline void
san_junk_ptr_locations(void *ptr, size_t usize, void **first, void **mid,
    void **last) {
	size_t ptr_sz = sizeof(void *);

	*first = ptr;

	*mid = (void *)((byte_t *)ptr + ((usize >> 1) & ~(ptr_sz - 1)));
	assert(*first != *mid || usize == ptr_sz);
	assert((uintptr_t)*first <= (uintptr_t)*mid);

	/*
	 * When usize > 32K, the gap between requested_size and usize might be
	 * greater than 4K -- this means the last write may access an
	 * likely-untouched page (default settings w/ 4K pages).  However by
	 * default the tcache only goes up to the 32K size class, and is usually
	 * tuned lower instead of higher, which makes it less of a concern.
	 */
	*last = (void *)((byte_t *)ptr + usize - sizeof(uaf_detect_junk));
	assert(*first != *last || usize == ptr_sz);
	assert(*mid != *last || usize <= ptr_sz * 2);
	assert((uintptr_t)*mid <= (uintptr_t)*last);
}